

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O3

void __thiscall
cmMakefile::AddEvaluationFile
          (cmMakefile *this,string *inputFile,auto_ptr<cmCompiledGeneratorExpression> *outputName,
          auto_ptr<cmCompiledGeneratorExpression> *condition,bool inputIsContent)

{
  pointer *pppcVar1;
  iterator __position;
  PolicyStatus policyStatusCMP0070;
  cmGeneratorExpressionEvaluationFile *this_00;
  auto_ptr<cmCompiledGeneratorExpression> local_48;
  auto_ptr<cmCompiledGeneratorExpression> local_40;
  cmGeneratorExpressionEvaluationFile *local_38;
  
  this_00 = (cmGeneratorExpressionEvaluationFile *)operator_new(0x50);
  local_40 = (auto_ptr<cmCompiledGeneratorExpression>)outputName->x_;
  outputName->x_ = (cmCompiledGeneratorExpression *)0x0;
  local_48 = (auto_ptr<cmCompiledGeneratorExpression>)condition->x_;
  condition->x_ = (cmCompiledGeneratorExpression *)0x0;
  policyStatusCMP0070 = cmStateSnapshot::GetPolicy(&this->StateSnapshot,CMP0070);
  cmGeneratorExpressionEvaluationFile::cmGeneratorExpressionEvaluationFile
            (this_00,inputFile,&local_40,&local_48,inputIsContent,policyStatusCMP0070);
  __position._M_current =
       (this->EvaluationFiles).
       super__Vector_base<cmGeneratorExpressionEvaluationFile_*,_std::allocator<cmGeneratorExpressionEvaluationFile_*>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_38 = this_00;
  if (__position._M_current ==
      (this->EvaluationFiles).
      super__Vector_base<cmGeneratorExpressionEvaluationFile_*,_std::allocator<cmGeneratorExpressionEvaluationFile_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<cmGeneratorExpressionEvaluationFile*,std::allocator<cmGeneratorExpressionEvaluationFile*>>
    ::_M_realloc_insert<cmGeneratorExpressionEvaluationFile*>
              ((vector<cmGeneratorExpressionEvaluationFile*,std::allocator<cmGeneratorExpressionEvaluationFile*>>
                *)&this->EvaluationFiles,__position,&local_38);
  }
  else {
    *__position._M_current = this_00;
    pppcVar1 = &(this->EvaluationFiles).
                super__Vector_base<cmGeneratorExpressionEvaluationFile_*,_std::allocator<cmGeneratorExpressionEvaluationFile_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    *pppcVar1 = *pppcVar1 + 1;
  }
  ::cm::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr(&local_48);
  ::cm::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr(&local_40);
  return;
}

Assistant:

void cmMakefile::AddEvaluationFile(
  const std::string& inputFile,
  CM_AUTO_PTR<cmCompiledGeneratorExpression> outputName,
  CM_AUTO_PTR<cmCompiledGeneratorExpression> condition, bool inputIsContent)
{
  this->EvaluationFiles.push_back(new cmGeneratorExpressionEvaluationFile(
    inputFile, outputName, condition, inputIsContent,
    this->GetPolicyStatus(cmPolicies::CMP0070)));
}